

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::GetTerminalWidth(void)

{
  int iVar1;
  long lVar2;
  char *local_30;
  char *endptr;
  long t;
  char *columns;
  winsize ws;
  int width;
  
  ws.ws_row = 0xffff;
  ws.ws_col = 0xffff;
  iVar1 = ioctl(1,0x5413,(long)&columns + 4);
  if (((iVar1 != -1) && (columns._6_2_ != 0)) && (columns._4_2_ != 0)) {
    ws._0_4_ = ZEXT24(columns._6_2_);
  }
  iVar1 = isatty(1);
  if (iVar1 == 0) {
    ws.ws_row = 0xffff;
    ws.ws_col = 0xffff;
  }
  t = (long)getenv("COLUMNS");
  if (((((char *)t != (char *)0x0) && (*(char *)t != '\0')) &&
      ((lVar2 = strtol((char *)t,&local_30,0), local_30 != (char *)0x0 &&
       ((*local_30 == '\0' && (0 < lVar2)))))) && (lVar2 < 1000)) {
    ws._0_4_ = SUB84(lVar2,0);
  }
  if ((int)ws._0_4_ < 9) {
    ws.ws_row = 0xffff;
    ws.ws_col = 0xffff;
  }
  iVar1._0_2_ = ws.ws_row;
  iVar1._2_2_ = ws.ws_col;
  return iVar1;
}

Assistant:

int SystemTools::GetTerminalWidth()
{
  int width = -1;
#ifdef HAVE_TTY_INFO
  struct winsize ws;
  char *columns; /* Unix98 environment variable */
  if(ioctl(1, TIOCGWINSZ, &ws) != -1 && ws.ws_col>0 && ws.ws_row>0)
    {
    width = ws.ws_col;
    }
  if(!isatty(STDOUT_FILENO))
    {
    width = -1;
    }
  columns = getenv("COLUMNS");
  if(columns && *columns)
    {
    long t;
    char *endptr;
    t = strtol(columns, &endptr, 0);
    if(endptr && !*endptr && (t>0) && (t<1000))
      {
      width = static_cast<int>(t);
      }
    }
  if ( width < 9 )
    {
    width = -1;
    }
#endif
  return width;
}